

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_simple.c
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  undefined8 *in_RSI;
  int in_EDI;
  double dVar7;
  ALLEGRO_SAMPLE_INSTANCE *instance;
  _Bool ret;
  ALLEGRO_SAMPLE_ID new_sample_id;
  _Bool loop;
  char *filename;
  _Bool panning;
  int i;
  ALLEGRO_TIMER *timer;
  _Bool sample_id_valid;
  ALLEGRO_SAMPLE_ID sample_id;
  ALLEGRO_EVENT event;
  ALLEGRO_EVENT_QUEUE *event_queue;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_SAMPLE *sample_data [10];
  undefined8 local_f4;
  byte local_e9;
  undefined8 local_e8;
  byte local_dd;
  uint local_dc;
  undefined8 local_d8;
  byte local_c9;
  undefined8 local_c8;
  int local_c0;
  int local_a0;
  int local_9c;
  uint local_98;
  undefined8 local_78;
  long local_68 [11];
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memset(local_68,0,0x50);
  local_c9 = 0;
  local_dd = 0;
  uVar2 = al_install_system(0x85020700,atexit);
  if ((uVar2 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  open_log();
  if (local_8 < 2) {
    log_printf("This example needs to be run from the command line.\nUsage: %s {audio_files}\n",
               *local_10);
LAB_00102a23:
    al_destroy_display();
    close_log(false);
    return 0;
  }
  local_8 = local_8 + -1;
  local_10 = local_10 + 1;
  al_install_keyboard();
  lVar3 = al_create_display(0x280,0x1e0);
  if (lVar3 == 0) {
    abort_example("Could not create display\n");
  }
  local_d8 = al_create_timer(0x3f91111111111111);
  al_start_timer(local_d8);
  uVar4 = al_create_event_queue();
  local_78 = uVar4;
  uVar5 = al_get_keyboard_event_source();
  al_register_event_source(uVar4,uVar5);
  uVar4 = local_78;
  uVar5 = al_get_display_event_source(lVar3);
  al_register_event_source(uVar4,uVar5);
  uVar4 = local_78;
  al_get_timer_event_source(local_d8);
  al_register_event_source(uVar4);
  al_init_acodec_addon();
  do {
    uVar2 = al_install_audio();
    if ((uVar2 & 1) == 0) {
      abort_example("Could not init sound!\n");
    }
    uVar2 = al_reserve_samples(0x10);
    if ((uVar2 & 1) == 0) {
      abort_example("Could not set up voice and mixer.\n");
    }
    memset(local_68,0,0x50);
    for (local_dc = 0; (int)local_dc < local_8 && (int)local_dc < 10; local_dc = local_dc + 1) {
      local_e8 = local_10[(int)local_dc];
      lVar3 = al_load_sample(local_10[(int)local_dc]);
      local_68[(int)local_dc] = lVar3;
      if (local_68[(int)local_dc] == 0) {
        log_printf("Could not load sample from \'%s\'!\n",local_e8);
      }
    }
    log_printf(
              "Press digits to play sounds.\nSpace to stop sounds.\nAdd Alt to play sounds repeatedly.\n\'p\' to pan the last played sound.\nEscape to quit.\n"
              );
    do {
      while (al_wait_for_event(local_78), local_c0 != 0xb) {
        if (local_c0 == 0x2a) {
LAB_001029bc:
          for (local_dc = 0; (int)local_dc < local_8 && (int)local_dc < 10; local_dc = local_dc + 1)
          {
            if (local_68[(int)local_dc] != 0) {
              al_destroy_sample(local_68[(int)local_dc]);
            }
          }
          al_uninstall_audio();
          goto LAB_00102a23;
        }
        if (((local_c0 == 0x1e) && ((local_dd & 1) != 0)) && ((local_c9 & 1) != 0)) {
          lVar3 = al_lock_sample_id(&local_c8);
          if (lVar3 != 0) {
            dVar7 = (double)al_get_time();
            dVar7 = sin(dVar7);
            al_set_sample_instance_pan((float)dVar7,lVar3);
          }
          al_unlock_sample_id(&local_c8);
        }
      }
      if (local_a0 == 0x3b) goto LAB_001029bc;
      if (local_9c == 0x20) {
        log_printf("Stopping all sounds\n");
        al_stop_samples();
      }
      if ((0x2f < local_9c) && (local_9c < 0x3a)) {
        local_e9 = (local_98 & 4) != 0;
        local_dc = (local_9c + -0x27) % 10;
        if (local_68[(int)local_dc] != 0) {
          uVar4 = 0x100;
          if ((bool)local_e9) {
            uVar4 = 0x101;
          }
          bVar1 = al_play_sample(0x3f800000,0,local_68[(int)local_dc],uVar4,&local_f4);
          if ((bVar1 & 1) == 0) {
            log_printf("al_play_sample_data failed, perhaps too many sounds\n");
          }
          else {
            pcVar6 = "once";
            if ((local_e9 & 1) != 0) {
              pcVar6 = "repeatedly";
            }
            log_printf("Playing %d %s\n",(ulong)local_dc,pcVar6);
          }
          if (((local_dd & 1) == 0) && ((bVar1 & 1) != 0)) {
            local_c8 = local_f4;
            local_c9 = 1;
          }
        }
      }
      if ((local_9c == 0x70) && ((local_c9 & 1) != 0)) {
        local_dd = (local_dd ^ 0xff) & 1;
        if (local_dd == 0) {
          log_printf("Not panning\n");
        }
        else {
          log_printf("Panning\n");
        }
      }
    } while (local_9c != 0x72);
    for (local_dc = 0; (int)local_dc < local_8 && (int)local_dc < 10; local_dc = local_dc + 1) {
      if (local_68[(int)local_dc] != 0) {
        al_destroy_sample(local_68[(int)local_dc]);
      }
    }
    al_uninstall_audio();
  } while( true );
}

Assistant:

int main(int argc, const char *argv[])
{
   ALLEGRO_SAMPLE *sample_data[MAX_SAMPLE_DATA] = {NULL};
   ALLEGRO_DISPLAY *display = NULL;
   ALLEGRO_EVENT_QUEUE *event_queue;
   ALLEGRO_EVENT event;
   ALLEGRO_SAMPLE_ID sample_id;
   bool sample_id_valid = false;
   ALLEGRO_TIMER* timer;
   int i;
   bool panning = false;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc < 2) {
      log_printf("This example needs to be run from the command line.\nUsage: %s {audio_files}\n", argv[0]);
      goto done;
   }
   argc--;
   argv++;

   al_install_keyboard();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Could not create display\n");
   }

   timer = al_create_timer(1/60.0);
   al_start_timer(timer);
   event_queue = al_create_event_queue();
   al_register_event_source(event_queue, al_get_keyboard_event_source());
   al_register_event_source(event_queue, al_get_display_event_source(display));
   al_register_event_source(event_queue, al_get_timer_event_source(timer));

   al_init_acodec_addon();

Restart:

   if (!al_install_audio()) {
      abort_example("Could not init sound!\n");
   }

   if (!al_reserve_samples(RESERVED_SAMPLES)) {
      abort_example("Could not set up voice and mixer.\n");
   }

   memset(sample_data, 0, sizeof(sample_data));
   for (i = 0; i < argc && i < MAX_SAMPLE_DATA; i++) {
      const char *filename = argv[i];

      /* Load the entire sound file from disk. */
      sample_data[i] = al_load_sample(argv[i]);
      if (!sample_data[i]) {
         log_printf("Could not load sample from '%s'!\n", filename);
         continue;
      }
   }

   log_printf(
      "Press digits to play sounds.\n"
      "Space to stop sounds.\n"
      "Add Alt to play sounds repeatedly.\n"
      "'p' to pan the last played sound.\n"
      "Escape to quit.\n");

   while (true) {
      al_wait_for_event(event_queue, &event);
      if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
            break;
         }
         if (event.keyboard.unichar == ' ') {
            log_printf("Stopping all sounds\n");
            al_stop_samples();
         }

         if (event.keyboard.unichar >= '0' && event.keyboard.unichar <= '9') {
            bool loop = event.keyboard.modifiers & ALLEGRO_KEYMOD_ALT;
            i = (event.keyboard.unichar - '0' + 9) % 10;
            if (sample_data[i]) {
               ALLEGRO_SAMPLE_ID new_sample_id;
               bool ret = al_play_sample(sample_data[i], 1.0, 0.0, 1.0,
                  loop ? ALLEGRO_PLAYMODE_LOOP : ALLEGRO_PLAYMODE_ONCE, &new_sample_id);
               if (ret) {
                  log_printf("Playing %d %s\n", i, loop ? "repeatedly" : "once");
               }
               else {
                  log_printf(
                     "al_play_sample_data failed, perhaps too many sounds\n");
               }
               if (!panning) {
                  if (ret) {
                     sample_id = new_sample_id;
                     sample_id_valid = true;
                  }
               }
            }
         }

         if (event.keyboard.unichar == 'p') {
            if (sample_id_valid) {
               panning = !panning;
               if (panning) {
                  log_printf("Panning\n");
               }
               else {
                  log_printf("Not panning\n");
               }
            }
         }

         /* Hidden feature: restart audio subsystem.
          * For debugging race conditions on shutting down the audio.
          */
         if (event.keyboard.unichar == 'r') {
            for (i = 0; i < argc && i < MAX_SAMPLE_DATA; i++) {
               if (sample_data[i])
                  al_destroy_sample(sample_data[i]);
            }
            al_uninstall_audio();
            goto Restart;
         }
      }
      else if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
      else if (event.type == ALLEGRO_EVENT_TIMER) {
         if (panning && sample_id_valid) {
            ALLEGRO_SAMPLE_INSTANCE* instance = al_lock_sample_id(&sample_id);
            if (instance) {
               al_set_sample_instance_pan(instance, sin(al_get_time()));
            }
            al_unlock_sample_id(&sample_id);
         }
      }
   }

   for (i = 0; i < argc && i < MAX_SAMPLE_DATA; i++) {
      if (sample_data[i])
         al_destroy_sample(sample_data[i]);
   }

   /* Sample data and other objects will be automatically freed. */
   al_uninstall_audio();

done:
   al_destroy_display(display);
   close_log(false);
   return 0;
}